

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ss_fixdown(uchar *Td,int *PA,int *SA,int i,int size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  
  iVar4 = SA[(uint)i];
  bVar1 = Td[PA[iVar4]];
  while( true ) {
    iVar5 = i * 2 + 1;
    if (size <= iVar5) break;
    bVar2 = Td[PA[SA[iVar5]]];
    bVar3 = Td[PA[SA[(long)(i * 2) + 2]]];
    bVar6 = bVar3;
    if (bVar3 < bVar2) {
      bVar6 = bVar2;
    }
    if (bVar6 <= bVar1) break;
    if (bVar2 < bVar3) {
      iVar5 = i * 2 + 2;
    }
    SA[i] = SA[iVar5];
    i = iVar5;
  }
  SA[i] = iVar4;
  return;
}

Assistant:

static INLINE
void
ss_fixdown(const unsigned char *Td, const int *PA,
           int *SA, int i, int size) {
  int j, k;
  int v;
  int c, d, e;

  for(v = SA[i], c = Td[PA[v]]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[PA[SA[k = j++]]];
    if(d < (e = Td[PA[SA[j]]])) { k = j; d = e; }
    if(d <= c) { break; }
  }
  SA[i] = v;
}